

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

float32 __thiscall rw::Matrix::identityError(Matrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar11 = (float)(this->right).x + -1.0;
  fVar1 = (float)(this->right).y;
  fVar2 = (float)(this->right).z;
  fVar3 = (float)(this->up).x;
  fVar12 = (float)(this->up).y + -1.0;
  fVar4 = (float)(this->up).z;
  fVar5 = (float)(this->at).x;
  fVar10 = (float)(this->at).z + -1.0;
  fVar6 = (float)(this->at).y;
  fVar7 = (float)(this->pos).x;
  fVar8 = (float)(this->pos).y;
  fVar9 = (float)(this->pos).z;
  return (float32)(fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8 +
                  fVar10 * fVar10 + fVar5 * fVar5 + fVar6 * fVar6 +
                  fVar4 * fVar4 + fVar3 * fVar3 + fVar12 * fVar12 +
                  fVar2 * fVar2 + fVar11 * fVar11 + fVar1 * fVar1);
}

Assistant:

float32
Matrix::identityError(void)
{
	V3d r = { right.x-1.0f, right.y, right.z };
	V3d u = { up.x, up.y-1.0f, up.z };
	V3d a = { at.x, at.y, at.z-1.0f };
	return dot(r,r) + dot(u,u) + dot(a,a) + dot(pos,pos);
}